

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_page_locked(CPUArchState_conflict28 *env,int midx,target_ulong_conflict page)

{
  uint uVar1;
  uc_struct_conflict15 *uc;
  _Bool _Var2;
  CPUTLB_conflict5 *pCVar3;
  int64_t now;
  CPUTLBEntry *tlb_entry;
  target_ulong_conflict lp_mask;
  target_ulong_conflict lp_addr;
  target_ulong_conflict page_local;
  int midx_local;
  CPUArchState_conflict28 *env_local;
  
  pCVar3 = env_tlb(env);
  uVar1 = pCVar3->d[midx].large_page_addr;
  pCVar3 = env_tlb(env);
  if ((page & pCVar3->d[midx].large_page_mask) == uVar1) {
    now = get_clock_realtime();
    tlb_flush_one_mmuidx_locked(env,midx,now);
  }
  else {
    uc = env->uc;
    tlb_entry = ::tlb_entry(env,(long)midx,page);
    _Var2 = tlb_flush_entry_locked(uc,tlb_entry,page);
    if (_Var2) {
      tlb_n_used_entries_dec(env,(long)midx);
    }
    tlb_flush_vtlb_page_locked(env,midx,page);
  }
  return;
}

Assistant:

static void tlb_flush_page_locked(CPUArchState *env, int midx,
                                  target_ulong page)
{
    target_ulong lp_addr = env_tlb(env)->d[midx].large_page_addr;
    target_ulong lp_mask = env_tlb(env)->d[midx].large_page_mask;

    /* Check if we need to flush due to large pages.  */
    if ((page & lp_mask) == lp_addr) {
        tlb_flush_one_mmuidx_locked(env, midx, get_clock_realtime());
    } else {
        if (tlb_flush_entry_locked(env->uc, tlb_entry(env, midx, page), page)) {
            tlb_n_used_entries_dec(env, midx);
        }
        tlb_flush_vtlb_page_locked(env, midx, page);
    }
}